

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O2

void __thiscall
Logger::queueError<StringLiteral>(Logger *this,ErrorType type,char *text,StringLiteral *args)

{
  undefined4 in_register_00000034;
  string_view text_00;
  string message;
  string local_30;
  
  tinyformat::format<StringLiteral>
            (&local_30,(char *)CONCAT44(in_register_00000034,type),(StringLiteral *)text);
  text_00._M_str = (char *)args;
  text_00._M_len = (size_t)local_30._M_dataplus._M_p;
  queueError((Logger *)((ulong)this & 0xffffffff),(ErrorType)local_30._M_string_length,text_00);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void queueError(ErrorType type, const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		queueError(type,message);
	}